

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugin_CorrelationMeter.cpp
# Opt level: O0

int CorrelationMeter::ProcessCallback
              (UnityAudioEffectState *state,float *inbuffer,float *outbuffer,uint length,
              int inchannels,int outchannels)

{
  EffectData *pEVar1;
  int local_40;
  uint local_3c;
  int i;
  uint n;
  EffectData *data;
  int outchannels_local;
  int inchannels_local;
  uint length_local;
  float *outbuffer_local;
  float *inbuffer_local;
  UnityAudioEffectState *state_local;
  
  pEVar1 = UnityAudioEffectState::GetEffectData<CorrelationMeter::EffectData>(state);
  memcpy(outbuffer,inbuffer,(ulong)length * 4 * (long)inchannels);
  outbuffer_local = inbuffer;
  for (local_3c = 0; local_3c < length; local_3c = local_3c + 1) {
    for (local_40 = 0; local_40 < inchannels; local_40 = local_40 + 1) {
      HistoryBuffer::Feed((HistoryBuffer *)(pEVar1->p + (long)local_40 * 4 + 2),*outbuffer_local);
      outbuffer_local = outbuffer_local + 1;
    }
  }
  pEVar1->numchannels = inchannels;
  return 0;
}

Assistant:

UNITY_AUDIODSP_RESULT UNITY_AUDIODSP_CALLBACK ProcessCallback(UnityAudioEffectState* state, float* inbuffer, float* outbuffer, unsigned int length, int inchannels, int outchannels)
    {
        EffectData* data = state->GetEffectData<EffectData>();

        memcpy(outbuffer, inbuffer, sizeof(float) * length * inchannels);

        for (unsigned int n = 0; n < length; n++)
            for (int i = 0; i < inchannels; i++)
                data->history[i].Feed(*inbuffer++);
        data->numchannels = inchannels;

        return UNITY_AUDIODSP_OK;
    }